

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

iterator __thiscall
re2::SparseArray<re2::NFA::Thread_*>::set_existing
          (SparseArray<re2::NFA::Thread_*> *this,int i,Thread *v)

{
  Thread *pTVar1;
  bool bVar2;
  reference pvVar3;
  __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
  _Var4;
  __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
  local_30;
  Thread *local_28;
  Thread *v_local;
  SparseArray<re2::NFA::Thread_*> *pSStack_18;
  int i_local;
  SparseArray<re2::NFA::Thread_*> *this_local;
  
  local_28 = v;
  v_local._4_4_ = i;
  pSStack_18 = this;
  DebugCheckInvariants(this);
  bVar2 = has_index(this,v_local._4_4_);
  pTVar1 = local_28;
  if (!bVar2) {
    __assert_fail("has_index(i)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x176,
                  "typename SparseArray<Value>::iterator re2::SparseArray<re2::NFA::Thread *>::set_existing(int, Value) [Value = re2::NFA::Thread *]"
                 );
  }
  pvVar3 = std::
           vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
           ::operator[](&this->dense_,(long)this->sparse_to_dense_[v_local._4_4_]);
  pvVar3->second = pTVar1;
  DebugCheckInvariants(this);
  local_30._M_current =
       (IndexValue *)
       std::
       vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
       ::begin(&this->dense_);
  _Var4 = __gnu_cxx::
          __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
          ::operator+(&local_30,(long)this->sparse_to_dense_[v_local._4_4_]);
  return (iterator)_Var4._M_current;
}

Assistant:

typename SparseArray<Value>::iterator
SparseArray<Value>::set_existing(int i, Value v) {
  DebugCheckInvariants();
  DCHECK(has_index(i));
  dense_[sparse_to_dense_[i]].second = v;
  DebugCheckInvariants();
  return dense_.begin() + sparse_to_dense_[i];
}